

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void save_npc(DisasContext_conflict8 *dc)

{
  target_ulong arg;
  TCGContext_conflict8 *tcg_ctx;
  
  arg = dc->npc;
  if (arg != 1) {
    if (arg != 2) {
      tcg_ctx = dc->uc->tcg_ctx;
      tcg_gen_movi_i64_sparc64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_npc,arg);
      return;
    }
    gen_generic_branch(dc);
    dc->npc = 1;
  }
  return;
}

Assistant:

static inline void save_npc(DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (dc->npc == JUMP_PC) {
        gen_generic_branch(dc);
        dc->npc = DYNAMIC_PC;
    } else if (dc->npc != DYNAMIC_PC) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_npc, dc->npc);
    }
}